

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkStartFromWithLatches(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func,int nLatches)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pObj;
  Vec_Vec_t *pVVar7;
  Abc_Cex_t *pAVar8;
  Vec_Int_t *pVVar9;
  int *__dest;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->nObjCounts[8] != 0) {
      __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xb9,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    pNtk_00 = Abc_NtkAlloc(Type,Func,1);
    pNtk_00->nConstrs = pNtk->nConstrs;
    pNtk_00->nBarBufs = pNtk->nBarBufs;
    pcVar4 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar4;
    pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar4;
    Abc_NtkCleanCopy(pNtk);
    if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
      pAVar5 = Abc_AigConst1(pNtk_00);
      pAVar6 = Abc_AigConst1(pNtk);
      (pAVar6->field_6).pCopy = pAVar5;
    }
    pVVar10 = pNtk->vPis;
    iVar12 = pVVar10->nSize;
    if (nLatches < iVar12) {
      lVar13 = 0;
      do {
        if (iVar12 <= lVar13) goto LAB_0086ed49;
        Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar10->pArray[lVar13],(uint)(Type != ABC_NTK_NETLIST));
        lVar13 = lVar13 + 1;
        pVVar10 = pNtk->vPis;
        iVar12 = pVVar10->nSize;
      } while (lVar13 < iVar12 - nLatches);
    }
    pVVar10 = pNtk->vPos;
    iVar12 = pVVar10->nSize;
    if (nLatches < iVar12) {
      lVar13 = 0;
      do {
        if (iVar12 <= lVar13) goto LAB_0086ed49;
        Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar10->pArray[lVar13],(uint)(Type != ABC_NTK_NETLIST));
        lVar13 = lVar13 + 1;
        pVVar10 = pNtk->vPos;
        iVar12 = pVVar10->nSize;
      } while (lVar13 < iVar12 - nLatches);
    }
    if (0 < nLatches) {
      iVar12 = -nLatches;
      do {
        pAVar5 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_LATCH);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
        }
        pAVar5->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
        pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
        iVar1 = pNtk->vPos->nSize;
        uVar11 = iVar12 + iVar1;
        if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_0086ed49:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(Abc_Obj_t **)((long)pNtk->vPos->pArray[uVar11] + 0x40) = pAVar6;
        pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
        iVar1 = pNtk->vPis->nSize;
        uVar11 = iVar12 + iVar1;
        if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_0086ed49;
        *(Abc_Obj_t **)((long)pNtk->vPis->pArray[uVar11] + 0x40) = pObj;
        Abc_ObjAddFanin(pAVar5,pAVar6);
        Abc_ObjAddFanin(pObj,pAVar5);
        pcVar4 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar6,pcVar4,(char *)0x0);
        pcVar4 = Abc_ObjName(pObj);
        Abc_ObjAssignName(pObj,pcVar4,(char *)0x0);
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
    }
    Abc_ManTimeDup(pNtk,pNtk_00);
    if ((Vec_Vec_t *)pNtk->vOnehots != (Vec_Vec_t *)0x0) {
      pVVar7 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      pNtk_00->vOnehots = (Vec_Ptr_t *)pVVar7;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar8 = Abc_CexDup(pNtk->pSeqModel,pNtk->nObjCounts[8]);
      pNtk_00->pSeqModel = pAVar8;
    }
    pVVar2 = pNtk->vObjPerm;
    if (pVVar2 != (Vec_Int_t *)0x0) {
      pVVar9 = (Vec_Int_t *)malloc(0x10);
      iVar12 = pVVar2->nSize;
      lVar13 = (long)iVar12;
      pVVar9->nSize = iVar12;
      pVVar9->nCap = iVar12;
      if (lVar13 == 0) {
        __dest = (int *)0x0;
      }
      else {
        __dest = (int *)malloc(lVar13 * 4);
      }
      pVVar9->pArray = __dest;
      memcpy(__dest,pVVar2->pArray,lVar13 << 2);
      pNtk_00->vObjPerm = pVVar9;
    }
    pNtk_00->AndGateDelay = pNtk->AndGateDelay;
    if ((((pNtk->AndGateDelay != 0.0) || (NAN(pNtk->AndGateDelay))) &&
        (pNtk->pManTime != (Abc_ManTime_t *)0x0)) &&
       (((Type == ABC_NTK_STRASH && (pNtk->ntkType != ABC_NTK_STRASH)) &&
        (pVVar10 = pNtk->vCis, 0 < pVVar10->nSize)))) {
      lVar13 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)pVVar10->pArray[lVar13];
        fVar14 = Abc_NodeReadArrivalWorst(pAVar5);
        fVar15 = 0.0;
        if (0.0 <= fVar14) {
          fVar15 = fVar14;
        }
        pvVar3 = (pAVar5->field_6).pTemp;
        *(uint *)((long)pvVar3 + 0x14) =
             *(uint *)((long)pvVar3 + 0x14) & 0xfff | (int)(fVar15 / pNtk->AndGateDelay) << 0xc;
        lVar13 = lVar13 + 1;
        pVVar10 = pNtk->vCis;
      } while (lVar13 < pVVar10->nSize);
    }
    if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xee,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
      __assert_fail("Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xef,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    if (pNtk_00->nObjCounts[8] != nLatches) {
      __assert_fail("nLatches == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xf0,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFromWithLatches( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func, int nLatches )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    int fCopyNames, i;
    if ( pNtk == NULL )
        return NULL;
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    // decide whether to copy the names
    fCopyNames = ( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    for ( i = 0; i < Abc_NtkPiNum(pNtk)-nLatches; i++ )
        Abc_NtkDupObj( pNtkNew, Abc_NtkPi(pNtk, i), fCopyNames );
    for ( i = 0; i < Abc_NtkPoNum(pNtk)-nLatches; i++ )
        Abc_NtkDupObj( pNtkNew, Abc_NtkPo(pNtk, i), fCopyNames );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        Abc_NtkPo(pNtk, Abc_NtkPoNum(pNtk)-nLatches+i)->pCopy = pNode0;
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_NtkPi(pNtk, Abc_NtkPiNum(pNtk)-nLatches+i)->pCopy = pNode1;
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Abc_ObjAssignName( pNode0, Abc_ObjName(pNode0), NULL );
        Abc_ObjAssignName( pNode1, Abc_ObjName(pNode1), NULL );
    }
    // transfer logic level
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        pObj->pCopy->Level = pObj->Level;
    // transfer the names
//    Abc_NtkTrasferNames( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    if ( pNtk->vOnehots )
        pNtkNew->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    if ( pNtk->pSeqModel )
        pNtkNew->pSeqModel = Abc_CexDup( pNtk->pSeqModel, Abc_NtkLatchNum(pNtk) );
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    // initialize logic level of the CIs
    if ( pNtk->AndGateDelay != 0.0 && pNtk->pManTime != NULL && pNtk->ntkType != ABC_NTK_STRASH && Type == ABC_NTK_STRASH )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pCopy->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pObj)) / pNtk->AndGateDelay);
    }
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkCiNum(pNtk)    == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtk)    == Abc_NtkCoNum(pNtkNew) );
    assert( nLatches              == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}